

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O3

JSON_Value * json_parse_file_with_comments(char *filename)

{
  char *string;
  JSON_Value *pJVar1;
  
  string = read_file(filename);
  if (string == (char *)0x0) {
    pJVar1 = (JSON_Value *)0x0;
  }
  else {
    pJVar1 = json_parse_string_with_comments(string);
    (*parson_free)(string);
  }
  return pJVar1;
}

Assistant:

JSON_Value * json_parse_file_with_comments(const char *filename) {
    char *file_contents = read_file(filename);
    JSON_Value *output_value = NULL;
    if (file_contents == NULL) {
        return NULL;
    }
    output_value = json_parse_string_with_comments(file_contents);
    parson_free(file_contents);
    return output_value;
}